

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_header.cc
# Opt level: O0

void webrtc::WriteWavHeader
               (uint8_t *buf,size_t num_channels,int sample_rate,WavFormat format,
               size_t bytes_per_sample,size_t num_samples)

{
  bool bVar1;
  uint16_t x;
  uint32_t uVar2;
  ostream *poVar3;
  size_t bytes_in_payload_00;
  size_t bytes_in_payload;
  WavHeader header;
  FatalMessage local_1b0;
  FatalMessageVoidify local_31;
  size_t local_30;
  size_t num_samples_local;
  size_t bytes_per_sample_local;
  WavFormat format_local;
  int sample_rate_local;
  size_t num_channels_local;
  uint8_t *buf_local;
  
  local_30 = num_samples;
  num_samples_local = bytes_per_sample;
  bytes_per_sample_local._0_4_ = format;
  bytes_per_sample_local._4_4_ = sample_rate;
  _format_local = num_channels;
  num_channels_local = (size_t)buf;
  bVar1 = CheckWavParameters(num_channels,sample_rate,format,bytes_per_sample,num_samples);
  if (!bVar1) {
    rtc::FatalMessageVoidify::FatalMessageVoidify(&local_31);
    rtc::FatalMessage::FatalMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_header.cc"
               ,0x9b);
    poVar3 = rtc::FatalMessage::stream(&local_1b0);
    poVar3 = std::operator<<(poVar3,
                             "Check failed: CheckWavParameters(num_channels, sample_rate, format, bytes_per_sample, num_samples)"
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"# ");
    rtc::FatalMessageVoidify::operator&(&local_31,poVar3);
    rtc::FatalMessage::~FatalMessage(&local_1b0);
  }
  bytes_in_payload_00 = num_samples_local * local_30;
  WriteFourCC((uint32_t *)&bytes_in_payload,'R','I','F','F');
  uVar2 = RiffChunkSize(bytes_in_payload_00);
  WriteLE32((uint32_t *)((long)&bytes_in_payload + 4),uVar2);
  WriteFourCC((uint32_t *)&header,'W','A','V','E');
  WriteFourCC(&header.riff.header.Size,'f','m','t',' ');
  WriteLE32(&header.riff.Format,0x10);
  WriteLE16((uint16_t *)&header.fmt,(uint16_t)(WavFormat)bytes_per_sample_local);
  WriteLE16((uint16_t *)((long)&header.fmt.header.ID + 2),(uint16_t)_format_local);
  WriteLE32(&header.fmt.header.Size,bytes_per_sample_local._4_4_);
  uVar2 = ByteRate(_format_local,bytes_per_sample_local._4_4_,num_samples_local);
  WriteLE32((uint32_t *)&header.fmt.AudioFormat,uVar2);
  x = BlockAlign(_format_local,num_samples_local);
  WriteLE16((uint16_t *)&header.fmt.SampleRate,x);
  WriteLE16((uint16_t *)((long)&header.fmt.SampleRate + 2),(uint16_t)(num_samples_local << 3));
  WriteFourCC(&header.fmt.ByteRate,'d','a','t','a');
  WriteLE32((uint32_t *)&header.fmt.BlockAlign,(uint32_t)bytes_in_payload_00);
  memcpy((void *)num_channels_local,&bytes_in_payload,0x2c);
  return;
}

Assistant:

void WriteWavHeader(uint8_t* buf,
                    size_t num_channels,
                    int sample_rate,
                    WavFormat format,
                    size_t bytes_per_sample,
                    size_t num_samples) {
  RTC_CHECK(CheckWavParameters(num_channels, sample_rate, format,
                               bytes_per_sample, num_samples));

  WavHeader header;
  const size_t bytes_in_payload = bytes_per_sample * num_samples;

  WriteFourCC(&header.riff.header.ID, 'R', 'I', 'F', 'F');
  WriteLE32(&header.riff.header.Size, RiffChunkSize(bytes_in_payload));
  WriteFourCC(&header.riff.Format, 'W', 'A', 'V', 'E');

  WriteFourCC(&header.fmt.header.ID, 'f', 'm', 't', ' ');
  WriteLE32(&header.fmt.header.Size, kFmtSubchunkSize);
  WriteLE16(&header.fmt.AudioFormat, format);
  WriteLE16(&header.fmt.NumChannels, static_cast<uint16_t>(num_channels));
  WriteLE32(&header.fmt.SampleRate, sample_rate);
  WriteLE32(&header.fmt.ByteRate, ByteRate(num_channels, sample_rate,
                                           bytes_per_sample));
  WriteLE16(&header.fmt.BlockAlign, BlockAlign(num_channels, bytes_per_sample));
  WriteLE16(&header.fmt.BitsPerSample,
            static_cast<uint16_t>(8 * bytes_per_sample));

  WriteFourCC(&header.data.header.ID, 'd', 'a', 't', 'a');
  WriteLE32(&header.data.header.Size, static_cast<uint32_t>(bytes_in_payload));

  // Do an extra copy rather than writing everything to buf directly, since buf
  // might not be correctly aligned.
  memcpy(buf, &header, kWavHeaderSize);
}